

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O0

int tmcomp(tm *atmp,tm *btmp)

{
  int local_24;
  int result;
  tm *btmp_local;
  tm *atmp_local;
  
  if (atmp->tm_year == btmp->tm_year) {
    local_24 = atmp->tm_mon - btmp->tm_mon;
    if ((((local_24 == 0) && (local_24 = atmp->tm_mday - btmp->tm_mday, local_24 == 0)) &&
        (local_24 = atmp->tm_hour - btmp->tm_hour, local_24 == 0)) &&
       (local_24 = atmp->tm_min - btmp->tm_min, local_24 == 0)) {
      local_24 = atmp->tm_sec - btmp->tm_sec;
    }
    atmp_local._4_4_ = local_24;
  }
  else {
    atmp_local._4_4_ = 1;
    if (atmp->tm_year < btmp->tm_year) {
      atmp_local._4_4_ = -1;
    }
  }
  return atmp_local._4_4_;
}

Assistant:

static int tmcomp( const struct tm * atmp, const struct tm * btmp )
{
    int result;

    if ( atmp->tm_year != btmp->tm_year )
    {
        return atmp->tm_year < btmp->tm_year ? -1 : 1;
    }

    if ( ( result = ( atmp->tm_mon - btmp->tm_mon ) ) == 0 &&
         ( result = ( atmp->tm_mday - btmp->tm_mday ) ) == 0 &&
         ( result = ( atmp->tm_hour - btmp->tm_hour ) ) == 0 &&
         ( result = ( atmp->tm_min - btmp->tm_min ) ) == 0 )
    {
        result = atmp->tm_sec - btmp->tm_sec;
    }

    return result;
}